

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

pair<std::byte_*,_unsigned_long> __thiscall
BufferedFile::AdvanceStream(BufferedFile *this,size_t length)

{
  long lVar1;
  pointer pbVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  pair<std::byte_*,_unsigned_long> pVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = this->nSrcPos;
  uVar4 = this->m_read_pos;
  if (uVar7 < uVar4) {
    __assert_fail("m_read_pos <= nSrcPos",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/streams.h"
                  ,0x1f7,"std::pair<std::byte *, size_t> BufferedFile::AdvanceStream(size_t)");
  }
  if (this->nReadLimit < uVar4 + length) {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar3,(error_code *)"Attempt to position past buffer limit");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    if (length != 0 && uVar4 == uVar7) {
      Fill(this);
      uVar7 = this->nSrcPos;
      uVar4 = this->m_read_pos;
    }
    pbVar2 = (this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pbVar2;
    uVar5 = uVar4 % uVar6;
    uVar6 = uVar6 - uVar5;
    if (length <= uVar6) {
      uVar6 = length;
    }
    if (uVar7 - uVar4 < uVar6) {
      uVar6 = uVar7 - uVar4;
    }
    this->m_read_pos = uVar4 + uVar6;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pVar8.second = uVar6;
      pVar8.first = pbVar2 + uVar5;
      return pVar8;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::pair<std::byte*, size_t> AdvanceStream(size_t length)
    {
        assert(m_read_pos <= nSrcPos);
        if (m_read_pos + length > nReadLimit) {
            throw std::ios_base::failure("Attempt to position past buffer limit");
        }
        // If there are no bytes available, read from the file.
        if (m_read_pos == nSrcPos && length > 0) Fill();

        size_t buffer_offset{static_cast<size_t>(m_read_pos % vchBuf.size())};
        size_t buffer_available{static_cast<size_t>(vchBuf.size() - buffer_offset)};
        size_t bytes_until_source_pos{static_cast<size_t>(nSrcPos - m_read_pos)};
        size_t advance{std::min({length, buffer_available, bytes_until_source_pos})};
        m_read_pos += advance;
        return std::make_pair(&vchBuf[buffer_offset], advance);
    }